

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O2

void proc_reloc(void)

{
  t_proc *ptVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  t_symbol *ptVar6;
  t_symbol *ptVar7;
  int iVar8;
  
  iVar2 = bank_limit;
  if (proc_nb != 0) {
    bank = max_bank + 1;
    iVar8 = 0;
    iVar3 = max_bank;
    iVar5 = bank;
    for (proc_ptr = proc_first; proc_ptr != (t_proc *)0x0; proc_ptr = proc_ptr->link) {
      ptVar1 = proc_ptr->group;
      iVar3 = iVar5;
      if (ptVar1 == (t_proc *)0x0) {
        if (0x2000 < proc_ptr->size + iVar8) {
          bank = iVar5 + 1;
          iVar8 = 0;
          iVar3 = bank;
        }
        if (iVar2 < iVar3) {
          fatal_error("Not enough ROM space for procs!");
          return;
        }
        proc_ptr->bank = iVar3;
        proc_ptr->org = iVar8;
        iVar8 = proc_ptr->size + iVar8;
      }
      else {
        proc_ptr->bank = iVar5;
        proc_ptr->org = proc_ptr->org + (ptVar1->org - ptVar1->base);
      }
      max_bank = iVar3;
      proc_ptr->refcnt = 0;
      iVar5 = iVar3;
    }
    for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
      ptVar6 = (t_symbol *)(hash_tbl + lVar4);
      while (ptVar6 = ptVar6->next, ptVar6 != (t_symbol *)0x0) {
        ptVar1 = ptVar6->proc;
        proc_ptr = ptVar1;
        if (ptVar1 != (t_proc *)0x0) {
          ptVar6->bank = ptVar1->bank;
          ptVar6->value = ptVar6->value + (ptVar1->org - ptVar1->base);
          ptVar7 = ptVar6->local;
          if (ptVar7 != (t_symbol *)0x0) {
            for (; ptVar7 != (t_symbol *)0x0; ptVar7 = ptVar7->next) {
              ptVar1 = ptVar7->proc;
              proc_ptr = ptVar1;
              if (ptVar1 != (t_proc *)0x0) {
                ptVar7->bank = ptVar1->bank;
                ptVar7->value = ptVar7->value + (ptVar1->org - ptVar1->base);
              }
            }
          }
        }
      }
    }
    lablset("_call_bank",bank_base + iVar3 + 1);
    proc_ptr = (t_proc *)0x0;
    proc_nb = 0;
  }
  return;
}

Assistant:

void
proc_reloc(void)
{
	struct t_symbol *sym;
	struct t_symbol *local;
	struct t_proc   *group;
	int i;
	int addr;
	int tmp;

	if (proc_nb == 0)
		return;

	/* init */
	proc_ptr = proc_first;
	bank = max_bank + 1;
	addr = 0;

	/* alloc memory */
	while (proc_ptr) {
		/* proc */
		if (proc_ptr->group == NULL) {
			tmp = addr + proc_ptr->size;
	
			/* bank change */
			if (tmp > 0x2000) {
				bank++;
				addr = 0;
			}
			if (bank > bank_limit) {
				fatal_error("Not enough ROM space for procs!");
				return;
			}

			/* reloc proc */
			proc_ptr->bank = bank;
			proc_ptr->org = addr;
			addr += proc_ptr->size;
		}

		/* group */
		else {
			/* reloc proc */
			group = proc_ptr->group;
			proc_ptr->bank = bank;
			proc_ptr->org += (group->org - group->base);
		}

		/* next */
		max_bank = bank;
		proc_ptr->refcnt = 0;
		proc_ptr = proc_ptr->link;
	}

	/* remap proc symbols */
	for (i = 0; i < 256; i++) {
		sym = hash_tbl[i];

		while (sym) {
			proc_ptr = sym->proc;

			/* remap addr */
			if (sym->proc) {
				sym->bank   =  proc_ptr->bank;
				sym->value += (proc_ptr->org - proc_ptr->base);

				/* local symbols */
				if (sym->local) {
					local = sym->local;
	
					while (local) {
						proc_ptr = local->proc;
			
						/* remap addr */
						if (local->proc) {
							local->bank   =  proc_ptr->bank;
							local->value += (proc_ptr->org - proc_ptr->base);
						}
		
						/* next */
						local = local->next;
					}
				}
			}

			/* next */
			sym = sym->next;
		}
	}

	/* reserve call bank */
	lablset("_call_bank", bank_base + max_bank + 1);

	/* reset */
	proc_ptr = NULL;
	proc_nb = 0;
}